

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImVec2 pos;
  
  pIVar3 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    id = GImGui->ActiveIdWindow->MoveId;
    if (id != GImGui->ActiveId) {
      return;
    }
    KeepAliveID(id);
    if ((pIVar3->IO).MouseDown[0] != false) {
      return;
    }
    ClearActiveID();
    return;
  }
  KeepAliveID(GImGui->ActiveId);
  if ((pIVar3->MovingWindow == (ImGuiWindow *)0x0) ||
     (window = pIVar3->MovingWindow->RootWindow, window == (ImGuiWindow *)0x0)) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xcbd,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  if (((pIVar3->IO).MouseDown[0] != true) ||
     (bVar4 = IsMousePosValid(&(pIVar3->IO).MousePos), !bVar4)) {
    ClearActiveID();
    pIVar3->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar2 = (pIVar3->IO).MousePos;
  pos.x = IVar2.x - (pIVar3->ActiveIdClickOffset).x;
  pos.y = IVar2.y - (pIVar3->ActiveIdClickOffset).y;
  fVar1 = (window->Pos).x;
  if ((fVar1 == pos.x) && (!NAN(fVar1) && !NAN(pos.x))) {
    fVar1 = (window->Pos).y;
    if ((fVar1 == pos.y) && (!NAN(fVar1) && !NAN(pos.y))) goto LAB_001ca138;
  }
  MarkIniSettingsDirty(window);
  SetWindowPos(window,&pos,1);
LAB_001ca138:
  FocusWindow(pIVar3->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}